

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::SpotLightSource::readFrom(SpotLightSource *this,BinaryReader *binary)

{
  size_t in_RCX;
  void *__buf;
  BinaryReader *in_RSI;
  vec3f *in_RDI;
  
  BinaryReader::read<pbrt::math::vec3f,void>(in_RSI,in_RDI);
  BinaryReader::read<pbrt::math::vec3f,void>(in_RSI,in_RDI);
  BinaryReader::read<pbrt::math::vec3f,void>(in_RSI,in_RDI);
  BinaryReader::read(in_RSI,(int)in_RDI + 0x40,__buf,in_RCX);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<pbrt::math::vec3f,void>(in_RSI,in_RDI);
  return;
}

Assistant:

void SpotLightSource::readFrom(BinaryReader &binary) 
  {
    binary.read(from);
    binary.read(to);
    binary.read(I);
    binary.read(Ispectrum);
    binary.read(coneAngle);
    binary.read(coneDeltaAngle);
    binary.read(scale);
  }